

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O3

StackNode * __thiscall
KokkosTools::SpaceTimeStack::StackNode::get_child
          (StackNode *this,string *child_name,StackKind child_kind)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator iVar3;
  pair<std::_Rb_tree_iterator<KokkosTools::SpaceTimeStack::StackNode>,_bool> pVar4;
  StackNode candidate;
  key_type local_b8;
  
  paVar2 = &local_b8.name.field_2;
  local_b8.name._M_dataplus._M_p = (child_name->_M_dataplus)._M_p;
  paVar1 = &child_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.name._M_dataplus._M_p == paVar1) {
    local_b8.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b8.name.field_2._8_8_ = *(undefined8 *)((long)&child_name->field_2 + 8);
    local_b8.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b8.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_b8.name._M_string_length = child_name->_M_string_length;
  local_b8.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8.children._M_t._M_impl.super__Rb_tree_header._M_header;
  (child_name->_M_dataplus)._M_p = (pointer)paVar1;
  child_name->_M_string_length = 0;
  (child_name->field_2)._M_local_buf[0] = '\0';
  local_b8.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8.children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8.total_runtime = 0.0;
  local_b8.total_kokkos_runtime = 0.0;
  local_b8.number_of_calls = 0;
  local_b8.total_number_of_kernel_calls = 0;
  local_b8.start_time.impl.__d.__r = (Impl)(duration)0x0;
  local_b8.parent = this;
  local_b8.kind = child_kind;
  local_b8.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar3 = std::
          _Rb_tree<KokkosTools::SpaceTimeStack::StackNode,_KokkosTools::SpaceTimeStack::StackNode,_std::_Identity<KokkosTools::SpaceTimeStack::StackNode>,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
          ::find(&(this->children)._M_t,&local_b8);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->children)._M_t._M_impl.super__Rb_tree_header) {
    pVar4 = std::
            _Rb_tree<KokkosTools::SpaceTimeStack::StackNode,_KokkosTools::SpaceTimeStack::StackNode,_std::_Identity<KokkosTools::SpaceTimeStack::StackNode>,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
            ::_M_emplace_unique<KokkosTools::SpaceTimeStack::StackNode>
                      (&(this->children)._M_t,&local_b8);
    iVar3._M_node = (_Base_ptr)pVar4.first._M_node;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("res.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp"
                    ,0xb0,
                    "StackNode *KokkosTools::SpaceTimeStack::StackNode::get_child(std::string &&, StackKind)"
                   );
    }
  }
  std::
  _Rb_tree<KokkosTools::SpaceTimeStack::StackNode,_KokkosTools::SpaceTimeStack::StackNode,_std::_Identity<KokkosTools::SpaceTimeStack::StackNode>,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
  ::~_Rb_tree(&local_b8.children._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.name._M_dataplus._M_p,local_b8.name.field_2._M_allocated_capacity + 1);
  }
  return (StackNode *)(iVar3._M_node + 1);
}

Assistant:

StackNode* get_child(std::string&& child_name, StackKind child_kind) {
    StackNode candidate(this, std::move(child_name), child_kind);
    auto it = children.find(candidate);
    if (it == children.end()) {
      auto res = children.emplace(std::move(candidate));
      it       = res.first;
      assert(res.second);
    }
    return const_cast<StackNode*>(&(*(it)));
  }